

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool utext_equals_63(UText *a,UText *b)

{
  int64_t iVar1;
  int64_t iVar2;
  UText *b_local;
  UText *a_local;
  
  if ((((a == (UText *)0x0) || (b == (UText *)0x0)) || (a->magic != 0x345ad82c)) ||
     (b->magic != 0x345ad82c)) {
    a_local._7_1_ = '\0';
  }
  else if (a->pFuncs == b->pFuncs) {
    if (a->context == b->context) {
      iVar1 = utext_getNativeIndex_63(a);
      iVar2 = utext_getNativeIndex_63(b);
      if (iVar1 == iVar2) {
        a_local._7_1_ = '\x01';
      }
      else {
        a_local._7_1_ = '\0';
      }
    }
    else {
      a_local._7_1_ = '\0';
    }
  }
  else {
    a_local._7_1_ = '\0';
  }
  return a_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
utext_equals(const UText *a, const UText *b) {
    if (a==NULL || b==NULL ||
        a->magic != UTEXT_MAGIC ||
        b->magic != UTEXT_MAGIC) {
            // Null or invalid arguments don't compare equal to anything.
            return FALSE;
    }

    if (a->pFuncs != b->pFuncs) {
        // Different types of text providers.
        return FALSE;
    }

    if (a->context != b->context) {
        // Different sources (different strings)
        return FALSE;
    }
    if (utext_getNativeIndex(a) != utext_getNativeIndex(b)) {
        // Different current position in the string.
        return FALSE;
    }

    return TRUE;
}